

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_24UL> *param_5)

{
  float *value;
  Array<char> AStack_48;
  CappedArray<char,_24UL> local_30;
  
  operator*<double>(&AStack_48);
  toCharSequence<float&>(&local_30,(kj *)(param_2 + 0x10),value);
  concat<kj::String,kj::StringPtr&,kj::CappedArray<char,24ul>>
            (__return_storage_ptr__,(_ *)&AStack_48,(String *)(param_2 + 0x18),
             (StringPtr *)&local_30,param_5);
  Array<char>::~Array(&AStack_48);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}